

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

NumericData * __thiscall
QLocaleData::numericData(NumericData *__return_storage_ptr__,QLocaleData *this,NumberMode mode)

{
  ushort uVar1;
  qsizetype qVar2;
  long lVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  long in_FS_OFFSET;
  QStringView zero;
  QStringView zero_00;
  QArrayDataPointer<char16_t> local_48;
  anon_class_8_1_ba1d7a2d local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->zeroUcs = &DAT_aaaaaaaaaaaaaaaa;
  memset(__return_storage_ptr__,0,0xb7);
  if (this == locale_data) {
    __return_storage_ptr__->isC = true;
  }
  else {
    zero.m_size = (ulong)this->m_zero_size;
    zero.m_data = L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                  + this->m_zero_idx;
    NumericData::setZero(__return_storage_ptr__,zero);
    uVar1 = this->m_groupDelim_idx;
    (__return_storage_ptr__->group).m_size = (ulong)this->m_groupDelim_size;
    (__return_storage_ptr__->group).m_data =
         L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
         + uVar1;
    uVar1 = this->m_minus_idx;
    (__return_storage_ptr__->minus).m_size = (ulong)this->m_minus_size;
    (__return_storage_ptr__->minus).m_data =
         L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
         + uVar1;
    uVar1 = this->m_plus_idx;
    (__return_storage_ptr__->plus).m_size = (ulong)this->m_plus_size;
    (__return_storage_ptr__->plus).m_data =
         L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
         + uVar1;
    if (mode != IntegerMode) {
      uVar1 = this->m_decimalSeparator_idx;
      (__return_storage_ptr__->decimal).m_size = (ulong)this->m_decimalSeparator_size;
      (__return_storage_ptr__->decimal).m_data =
           L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
           + uVar1;
      if (mode == DoubleScientificMode) {
        uVar1 = this->m_exponential_idx;
        (__return_storage_ptr__->exponent).m_size = (ulong)this->m_exponential_size;
        (__return_storage_ptr__->exponent).m_data =
             L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
             + uVar1;
        __return_storage_ptr__->exponentCyrillic = this->m_script_id == 0x1b;
      }
    }
    if (this == &systemLocaleData) {
      local_30.sys = systemLocale();
      if (mode != IntegerMode) {
        numericData::anon_class_8_1_ba1d7a2d::operator()
                  ((QString *)&local_48,&local_30,DecimalPoint);
        pDVar5 = (__return_storage_ptr__->sysDecimal).d.d;
        pcVar4 = (__return_storage_ptr__->sysDecimal).d.ptr;
        (__return_storage_ptr__->sysDecimal).d.d = local_48.d;
        (__return_storage_ptr__->sysDecimal).d.ptr = local_48.ptr;
        qVar2 = (__return_storage_ptr__->sysDecimal).d.size;
        (__return_storage_ptr__->sysDecimal).d.size = local_48.size;
        local_48.d = pDVar5;
        local_48.ptr = pcVar4;
        local_48.size = qVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        lVar3 = (__return_storage_ptr__->sysDecimal).d.size;
        if (lVar3 != 0) {
          pcVar4 = (__return_storage_ptr__->sysDecimal).d.ptr;
          (__return_storage_ptr__->decimal).m_size = lVar3;
          (__return_storage_ptr__->decimal).m_data = pcVar4;
        }
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()
                ((QString *)&local_48,&local_30,GroupSeparator);
      pDVar5 = (__return_storage_ptr__->sysGroup).d.d;
      pcVar4 = (__return_storage_ptr__->sysGroup).d.ptr;
      (__return_storage_ptr__->sysGroup).d.d = local_48.d;
      (__return_storage_ptr__->sysGroup).d.ptr = local_48.ptr;
      qVar2 = (__return_storage_ptr__->sysGroup).d.size;
      (__return_storage_ptr__->sysGroup).d.size = local_48.size;
      local_48.d = pDVar5;
      local_48.ptr = pcVar4;
      local_48.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      lVar3 = (__return_storage_ptr__->sysGroup).d.size;
      if (lVar3 != 0) {
        pcVar4 = (__return_storage_ptr__->sysGroup).d.ptr;
        (__return_storage_ptr__->group).m_size = lVar3;
        (__return_storage_ptr__->group).m_data = pcVar4;
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()((QString *)&local_48,&local_30,NegativeSign);
      pDVar5 = (__return_storage_ptr__->sysMinus).d.d;
      pcVar4 = (__return_storage_ptr__->sysMinus).d.ptr;
      (__return_storage_ptr__->sysMinus).d.d = local_48.d;
      (__return_storage_ptr__->sysMinus).d.ptr = local_48.ptr;
      qVar2 = (__return_storage_ptr__->sysMinus).d.size;
      (__return_storage_ptr__->sysMinus).d.size = local_48.size;
      local_48.d = pDVar5;
      local_48.ptr = pcVar4;
      local_48.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      lVar3 = (__return_storage_ptr__->sysMinus).d.size;
      if (lVar3 != 0) {
        pcVar4 = (__return_storage_ptr__->sysMinus).d.ptr;
        (__return_storage_ptr__->minus).m_size = lVar3;
        (__return_storage_ptr__->minus).m_data = pcVar4;
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()((QString *)&local_48,&local_30,PositiveSign);
      pDVar5 = (__return_storage_ptr__->sysPlus).d.d;
      pcVar4 = (__return_storage_ptr__->sysPlus).d.ptr;
      (__return_storage_ptr__->sysPlus).d.d = local_48.d;
      (__return_storage_ptr__->sysPlus).d.ptr = local_48.ptr;
      qVar2 = (__return_storage_ptr__->sysPlus).d.size;
      (__return_storage_ptr__->sysPlus).d.size = local_48.size;
      local_48.d = pDVar5;
      local_48.ptr = pcVar4;
      local_48.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      lVar3 = (__return_storage_ptr__->sysPlus).d.size;
      if (lVar3 != 0) {
        pcVar4 = (__return_storage_ptr__->sysPlus).d.ptr;
        (__return_storage_ptr__->plus).m_size = lVar3;
        (__return_storage_ptr__->plus).m_data = pcVar4;
      }
      numericData::anon_class_8_1_ba1d7a2d::operator()((QString *)&local_48,&local_30,ZeroDigit);
      zero_00.m_data = local_48.ptr;
      zero_00.m_size = local_48.size;
      NumericData::setZero(__return_storage_ptr__,zero_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QLocaleData::NumericData QLocaleData::numericData(QLocaleData::NumberMode mode) const
{
    NumericData result;
    if (this == c()) {
        result.isC = true;
        return result;
    }
    result.setZero(zero().viewData(single_character_data));
    result.group = groupDelim().viewData(single_character_data);
    // Note: minus, plus and exponent might not actually be single characters.
    result.minus = minus().viewData(single_character_data);
    result.plus = plus().viewData(single_character_data);
    if (mode != IntegerMode)
        result.decimal = decimalSeparator().viewData(single_character_data);
    if (mode == DoubleScientificMode) {
        result.exponent = exponential().viewData(single_character_data);
        // exponentCyrillic means "apply the Cyrrilic-specific exponent hack"
        result.exponentCyrillic = m_script_id == QLocale::CyrillicScript;
    }
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        const auto getString = [sys = systemLocale()](QSystemLocale::QueryType query) {
            return sys->query(query).toString();
        };
        if (mode != IntegerMode) {
            result.sysDecimal = getString(QSystemLocale::DecimalPoint);
            if (result.sysDecimal.size())
                result.decimal = QStringView{result.sysDecimal};
        }
        result.sysGroup = getString(QSystemLocale::GroupSeparator);
        if (result.sysGroup.size())
            result.group = QStringView{result.sysGroup};
        result.sysMinus = getString(QSystemLocale::NegativeSign);
        if (result.sysMinus.size())
            result.minus = QStringView{result.sysMinus};
        result.sysPlus = getString(QSystemLocale::PositiveSign);
        if (result.sysPlus.size())
            result.plus = QStringView{result.sysPlus};
        result.setZero(getString(QSystemLocale::ZeroDigit));
    }
#endif

    return result;
}